

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O2

size_t despace32(char *bytes,size_t howmany)

{
  size_t sVar1;
  size_t i;
  
  sVar1 = 0;
  for (i = 0; howmany != i; i = i + 1) {
    if (0x20 < (byte)bytes[i]) {
      bytes[sVar1] = bytes[i];
      sVar1 = sVar1 + 1;
    }
  }
  return sVar1;
}

Assistant:

size_t despace32(char *bytes, size_t howmany) {
  size_t pos = 0;
  for (size_t i = 0; i < howmany; i++) {
    char c = bytes[i];
    if ((unsigned char)c <= 32) {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}